

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::RemoveDeadMembers(EliminateDeadMembersPass *this)

{
  Module *pMVar1;
  anon_class_16_2_3b81a10e local_78;
  function<void_(spvtools::opt::Instruction_*)> local_68;
  anon_class_16_2_3b81a10e local_48;
  function<void_(spvtools::opt::Instruction_*)> local_38;
  bool local_11;
  EliminateDeadMembersPass *pEStack_10;
  bool modified;
  EliminateDeadMembersPass *this_local;
  
  local_11 = false;
  pEStack_10 = this;
  pMVar1 = Pass::get_module((Pass *)this);
  local_48.modified = &local_11;
  local_48.this = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::EliminateDeadMembersPass::RemoveDeadMembers()::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_38,&local_48);
  Module::ForEachInst(pMVar1,&local_38,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_38);
  pMVar1 = Pass::get_module((Pass *)this);
  local_78.modified = &local_11;
  local_78.this = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::EliminateDeadMembersPass::RemoveDeadMembers()::__1,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_68,&local_78);
  Module::ForEachInst(pMVar1,&local_68,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_68);
  return (bool)(local_11 & 1);
}

Assistant:

bool EliminateDeadMembersPass::RemoveDeadMembers() {
  bool modified = false;

  // First update all of the OpTypeStruct instructions.
  get_module()->ForEachInst([&modified, this](Instruction* inst) {
    switch (inst->opcode()) {
      case spv::Op::OpTypeStruct:
        modified |= UpdateOpTypeStruct(inst);
        break;
      default:
        break;
    }
  });

  // Now update all of the instructions that reference the OpTypeStructs.
  get_module()->ForEachInst([&modified, this](Instruction* inst) {
    switch (inst->opcode()) {
      case spv::Op::OpMemberName:
        modified |= UpdateOpMemberNameOrDecorate(inst);
        break;
      case spv::Op::OpMemberDecorate:
        modified |= UpdateOpMemberNameOrDecorate(inst);
        break;
      case spv::Op::OpGroupMemberDecorate:
        modified |= UpdateOpGroupMemberDecorate(inst);
        break;
      case spv::Op::OpSpecConstantComposite:
      case spv::Op::OpConstantComposite:
      case spv::Op::OpCompositeConstruct:
        modified |= UpdateConstantComposite(inst);
        break;
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
      case spv::Op::OpPtrAccessChain:
      case spv::Op::OpInBoundsPtrAccessChain:
        modified |= UpdateAccessChain(inst);
        break;
      case spv::Op::OpCompositeExtract:
        modified |= UpdateCompsiteExtract(inst);
        break;
      case spv::Op::OpCompositeInsert:
        modified |= UpdateCompositeInsert(inst);
        break;
      case spv::Op::OpArrayLength:
        modified |= UpdateOpArrayLength(inst);
        break;
      case spv::Op::OpSpecConstantOp:
        switch (spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx))) {
          case spv::Op::OpCompositeExtract:
            modified |= UpdateCompsiteExtract(inst);
            break;
          case spv::Op::OpCompositeInsert:
            modified |= UpdateCompositeInsert(inst);
            break;
          case spv::Op::OpAccessChain:
          case spv::Op::OpInBoundsAccessChain:
          case spv::Op::OpPtrAccessChain:
          case spv::Op::OpInBoundsPtrAccessChain:
            assert(false && "Not implemented yet.");
            break;
          default:
            break;
        }
        break;
      default:
        break;
    }
  });
  return modified;
}